

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_ret lzma_index_stream_padding(lzma_index *i,lzma_vli stream_padding)

{
  index_tree_node *piVar1;
  lzma_vli lVar2;
  lzma_vli lVar3;
  lzma_vli old_stream_padding;
  index_stream *s;
  lzma_vli stream_padding_local;
  lzma_index *i_local;
  
  if (((i == (lzma_index *)0x0) || (0x7fffffffffffffff < stream_padding)) ||
     ((stream_padding & 3) != 0)) {
    i_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    piVar1 = (i->streams).rightmost;
    lVar2 = piVar1[4].uncompressed_base;
    piVar1[4].uncompressed_base = 0;
    lVar3 = lzma_index_file_size(i);
    if (lVar3 + stream_padding < 0x8000000000000000) {
      piVar1[4].uncompressed_base = stream_padding;
      i_local._4_4_ = LZMA_OK;
    }
    else {
      piVar1[4].uncompressed_base = lVar2;
      i_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  return i_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_stream_padding(lzma_index *i, lzma_vli stream_padding)
{
	index_stream *s;
	lzma_vli old_stream_padding;

	if (i == NULL || stream_padding > LZMA_VLI_MAX
			|| (stream_padding & 3) != 0)
		return LZMA_PROG_ERROR;

	s = (index_stream *)(i->streams.rightmost);

	// Check that the new value won't make the file grow too big.
	old_stream_padding = s->stream_padding;
	s->stream_padding = 0;
	if (lzma_index_file_size(i) + stream_padding > LZMA_VLI_MAX) {
		s->stream_padding = old_stream_padding;
		return LZMA_DATA_ERROR;
	}

	s->stream_padding = stream_padding;
	return LZMA_OK;
}